

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

Matcher<const_google::protobuf::FileDescriptorProto_&> * __thiscall
testing::internal::
MatcherBaseImpl<upb_test::EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>>
::Apply<google::protobuf::FileDescriptorProto_const&,0ul>
          (void *__return_storage_ptr__,FileDescriptorProto *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  FileDescriptorProto local_110;
  
  puVar1 = (undefined8 *)operator_new(0x100);
  google::protobuf::FileDescriptorProto::FileDescriptorProto(&local_110,(Arena *)0x0,this);
  *puVar1 = &PTR__gmock_Impl_00582df0;
  google::protobuf::FileDescriptorProto::FileDescriptorProto
            ((FileDescriptorProto *)(puVar1 + 1),(Arena *)0x0,&local_110);
  *(undefined ***)__return_storage_ptr__ = &PTR__MatcherBase_00582f08;
  *(undefined8 *)((long)__return_storage_ptr__ + 8) = 0;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x10) = 0;
  *(undefined1 **)((long)__return_storage_ptr__ + 8) =
       MatcherBase<google::protobuf::FileDescriptorProto_const&>::
       GetVTable<testing::internal::MatcherBase<google::protobuf::FileDescriptorProto_const&>::ValuePolicy<testing::MatcherInterface<google::protobuf::FileDescriptorProto_const&>const*,true>>()
       ::kVTable;
  puVar2 = (undefined4 *)operator_new(0x10);
  *puVar2 = 1;
  *(undefined8 **)(puVar2 + 2) = puVar1;
  *(undefined4 **)((long)__return_storage_ptr__ + 0x10) = puVar2;
  *(undefined ***)__return_storage_ptr__ = &PTR__MatcherBase_00582e98;
  google::protobuf::FileDescriptorProto::~FileDescriptorProto(&local_110);
  return (Matcher<const_google::protobuf::FileDescriptorProto_&> *)__return_storage_ptr__;
}

Assistant:

::testing::Matcher<F> Apply(std::index_sequence<tuple_ids...>) const {
    return ::testing::Matcher<F>(
        new typename Derived<Ts...>::template gmock_Impl<F>(
            std::get<tuple_ids>(params_)...));
  }